

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O0

UCurrRegistryKey CReg::reg(UChar *_iso,char *_id,UErrorCode *status)

{
  UBool UVar1;
  CReg *this;
  char *size;
  CReg *local_58;
  CReg *n;
  UErrorCode *status_local;
  char *_id_local;
  UChar *_iso_local;
  
  if ((((status != (UErrorCode *)0x0) && (size = _id, UVar1 = ::U_SUCCESS(*status), UVar1 != '\0'))
      && (_iso != (UChar *)0x0)) && (_id != (char *)0x0)) {
    this = (CReg *)icu_63::UMemory::operator_new((UMemory *)0xb0,(size_t)size);
    local_58 = (CReg *)0x0;
    if (this != (CReg *)0x0) {
      CReg(this,_iso,_id);
      local_58 = this;
    }
    if (local_58 != (CReg *)0x0) {
      umtx_lock_63(&gCRegLock);
      if (gCRegHead == (CReg *)0x0) {
        ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
      }
      local_58->next = gCRegHead;
      gCRegHead = local_58;
      umtx_unlock_63(&gCRegLock);
      return local_58;
    }
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  return (UCurrRegistryKey)0x0;
}

Assistant:

static UCurrRegistryKey reg(const UChar* _iso, const char* _id, UErrorCode* status)
    {
        if (status && U_SUCCESS(*status) && _iso && _id) {
            CReg* n = new CReg(_iso, _id);
            if (n) {
                umtx_lock(&gCRegLock);
                if (!gCRegHead) {
                    /* register for the first time */
                    ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
                }
                n->next = gCRegHead;
                gCRegHead = n;
                umtx_unlock(&gCRegLock);
                return n;
            }
            *status = U_MEMORY_ALLOCATION_ERROR;
        }
        return 0;
    }